

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

bool __thiscall xatlas::internal::segment::Atlas::relocateSeed(Atlas *this,Chart *chart)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint8_t *puVar4;
  uint32_t face;
  ulong in_RAX;
  uint temp;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vector3 VVar14;
  uint32_t leastCentral;
  undefined8 local_38;
  
  uVar7 = (ulong)(chart->faces).m_base.size;
  (this->m_bestTriangles).m_pairs.m_base.size = 0;
  local_38 = in_RAX;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      if (((chart->faces).m_base.size <= uVar8) ||
         (fVar11 = evaluateProxyFitMetric
                             (this,chart,*(uint32_t *)((chart->faces).m_base.buffer + uVar8 * 4)),
         (chart->faces).m_base.size <= uVar8)) goto LAB_001b587e;
      CostQueue::push(&this->m_bestTriangles,fVar11,
                      *(uint32_t *)((chart->faces).m_base.buffer + uVar8 * 4));
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  local_38 = local_38 & 0xffffffff;
  if ((this->m_bestTriangles).m_pairs.m_base.size != 0) {
    local_38 = 0xbf800000;
    do {
      face = CostQueue::pop(&this->m_bestTriangles);
      VVar14 = Mesh::computeFaceCenter(this->m_mesh,face);
      fVar12 = (chart->centroid).x - VVar14.x;
      fVar13 = (chart->centroid).y - VVar14.y;
      fVar11 = (chart->centroid).z - VVar14.z;
      fVar11 = fVar11 * fVar11 + fVar12 * fVar12 + fVar13 * fVar13;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      if ((float)local_38 < fVar11) {
        local_38 = CONCAT44(face,fVar11);
      }
    } while ((this->m_bestTriangles).m_pairs.m_base.size != 0);
    if (0.0 <= (float)local_38) {
      uVar1 = (chart->seeds).m_base.size;
      bVar10 = uVar1 == 0;
      if (bVar10) {
LAB_001b5843:
        ArrayBase::push_back(&(chart->seeds).m_base,(uint8_t *)((long)&local_38 + 4));
      }
      else {
        puVar3 = (uint *)(chart->seeds).m_base.buffer;
        uVar5 = *puVar3;
        if (uVar5 == local_38._4_4_) {
          uVar8 = 0;
          uVar9 = 0;
        }
        else {
          uVar2 = (this->m_facePlanarRegionId).m_base.size;
          puVar4 = (this->m_facePlanarRegionId).m_base.buffer;
          uVar7 = 0;
          do {
            if ((uVar2 <= uVar5) || (uVar2 <= local_38._4_4_)) goto LAB_001b587e;
            iVar6 = (int)uVar7;
            if (*(int *)(puVar4 + (ulong)uVar5 * 4) == *(int *)(puVar4 + (ulong)local_38._4_4_ * 4))
            {
              uVar8 = uVar7 & 0xffffffff;
              uVar9 = uVar7;
              break;
            }
            uVar7 = uVar7 + 1;
            bVar10 = uVar1 <= (uint)uVar7;
            if (uVar1 - 1 == iVar6) goto LAB_001b5843;
            uVar9 = uVar7 & 0xffffffff;
            uVar5 = puVar3[uVar9];
            uVar8 = uVar7;
          } while (uVar5 != local_38._4_4_);
        }
        if (uVar1 <= (uint)uVar8) {
LAB_001b587e:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4ae,
                        "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]"
                       );
        }
        puVar3[uVar9] = puVar3[uVar1 - 1];
        puVar3[uVar1 - 1] = uVar5;
      }
      return bVar10;
    }
  }
  __assert_fail("maxDistance >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x151c,"bool xatlas::internal::segment::Atlas::relocateSeed(Chart *)");
}

Assistant:

bool relocateSeed(Chart *chart)
	{
		// Find the first N triangles that fit the proxy best.
		const uint32_t faceCount = chart->faces.size();
		m_bestTriangles.clear();
		for (uint32_t i = 0; i < faceCount; i++) {
			const float cost = evaluateProxyFitMetric(chart, chart->faces[i]);
			m_bestTriangles.push(cost, chart->faces[i]);
		}
		// Of those, choose the least central triangle.
		uint32_t leastCentral = 0;
		float maxDistance = -1;
		for (;;) {
			if (m_bestTriangles.count() == 0)
				break;
			const uint32_t face = m_bestTriangles.pop();
			Vector3 faceCentroid = m_mesh->computeFaceCenter(face);
			const float distance = length(chart->centroid - faceCentroid);
			if (distance > maxDistance) {
				maxDistance = distance;
				leastCentral = face;
			}
		}
		XA_DEBUG_ASSERT(maxDistance >= 0);
		// In order to prevent k-means cyles we record all the previously chosen seeds.
		for (uint32_t i = 0; i < chart->seeds.size(); i++) {
			// Treat seeds belong to the same planar region as equal.
			if (chart->seeds[i] == leastCentral || m_facePlanarRegionId[chart->seeds[i]] == m_facePlanarRegionId[leastCentral]) {
				// Move new seed to the end of the seed array.
				uint32_t last = chart->seeds.size() - 1;
				swap(chart->seeds[i], chart->seeds[last]);
				return false;
			}
		}
		// Append new seed.
		chart->seeds.push_back(leastCentral);
		return true;
	}